

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

void __thiscall
ON_Annotation::SetDimExtension(ON_Annotation *this,ON_DimStyle *parent_style,double extension)

{
  ON_DimStyle *pOVar1;
  double dVar2;
  
  pOVar1 = ON_DimStyle::DimStyleOrDefault(parent_style);
  dVar2 = ON_DimStyle::DimExtension(pOVar1);
  pOVar1 = Internal_GetOverrideStyle
                     (this,extension * 2.220446049250313e-16 < ABS(extension - dVar2));
  if (pOVar1 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetDimExtension(pOVar1,extension);
    ON_DimStyle::SetFieldOverride
              (pOVar1,DimensionLineExtension,
               extension * 2.220446049250313e-16 < ABS(extension - dVar2));
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetDimExtension(const ON_DimStyle* parent_style, double extension)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = Internal_DimStyleDoubleChanged(extension, parent_style->DimExtension());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetDimExtension(extension);
    override_style->SetFieldOverride(ON_DimStyle::field::DimensionLineExtension, bCreate);
  }
}